

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arcflowsol.cpp
# Opt level: O3

void __thiscall ArcflowSol::print_solution(ArcflowSol *this,bool print_inst,bool pyout)

{
  uint uVar1;
  pointer pvVar2;
  pointer ppVar3;
  pair<int,_int> pVar4;
  pair<int,_int> pVar5;
  pointer pIVar6;
  iterator iVar7;
  bool bVar8;
  ulong uVar9;
  undefined7 in_register_00000011;
  pointer ppVar10;
  ArcflowSol *pAVar11;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *__range3;
  undefined7 in_register_00000031;
  int_pair *itpair_1;
  pointer ppVar12;
  int iVar13;
  long lVar14;
  int_pair *itpair;
  pair<int,_int> *ppVar15;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> tmp;
  pair<int,_int> *local_78;
  iterator iStack_70;
  pair<int,_int> *local_68;
  pointer local_60;
  ArcflowSol *local_58;
  long local_50;
  pointer local_48;
  pair<int,_int> local_40;
  undefined4 local_38;
  undefined4 local_34;
  
  local_34 = (undefined4)CONCAT71(in_register_00000011,pyout);
  local_38 = (undefined4)CONCAT71(in_register_00000031,print_inst);
  printf("Objective: %d\n",(ulong)(uint)this->objvalue);
  puts("Solution:");
  uVar1 = (this->inst).nbtypes;
  uVar9 = (ulong)uVar1;
  local_58 = this;
  if (0 < (int)uVar1) {
    lVar14 = 0;
    do {
      pAVar11 = local_58;
      if (1 < (int)uVar9) {
        printf("Bins of type %d: %d\n",(ulong)((int)lVar14 + 1),
               (ulong)(uint)(local_58->nbins).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start[lVar14]);
      }
      pvVar2 = (pAVar11->sols).
               super__Vector_base<std::vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>,_std::allocator<std::vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      ppVar10 = pvVar2[lVar14].
                super__Vector_base<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_48 = *(pointer *)
                  ((long)&pvVar2[lVar14].
                          super__Vector_base<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data + 8);
      local_50 = lVar14;
      if (ppVar10 != local_48) {
        do {
          local_78 = (pair<int,_int> *)0x0;
          iStack_70._M_current = (pair<int,_int> *)0x0;
          local_68 = (pair<int,_int> *)0x0;
          ppVar12 = (ppVar10->second).
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          ppVar3 = *(pointer *)
                    ((long)&(ppVar10->second).
                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                            ._M_impl + 8);
          local_60 = ppVar10;
          if (ppVar12 != ppVar3) {
            do {
              if (0 < ppVar12->second) {
                pIVar6 = (local_58->inst).items.super__Vector_base<Item,_std::allocator<Item>_>.
                         _M_impl.super__Vector_impl_data._M_start + ppVar12->first;
                pVar4.first = pIVar6->type;
                pVar4.second = pIVar6->opt;
                iVar13 = 0;
                do {
                  local_40 = pVar4;
                  if (iStack_70._M_current == local_68) {
                    std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
                    _M_realloc_insert<std::pair<int,int>>
                              ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
                               &local_78,iStack_70,&local_40);
                  }
                  else {
                    *iStack_70._M_current = pVar4;
                    iStack_70._M_current = iStack_70._M_current + 1;
                  }
                  iVar13 = iVar13 + 1;
                } while (iVar13 < ppVar12->second);
              }
              iVar7._M_current = iStack_70._M_current;
              ppVar15 = local_78;
              ppVar12 = ppVar12 + 1;
            } while (ppVar12 != ppVar3);
            if (local_78 != iStack_70._M_current) {
              uVar9 = (long)iStack_70._M_current - (long)local_78 >> 3;
              lVar14 = 0x3f;
              if (uVar9 != 0) {
                for (; uVar9 >> lVar14 == 0; lVar14 = lVar14 + -1) {
                }
              }
              std::
              __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                        (local_78,iStack_70._M_current,((uint)lVar14 ^ 0x3f) * 2 ^ 0x7e);
              std::
              __final_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__ops::_Iter_less_iter>
                        (ppVar15,iVar7._M_current);
            }
          }
          printf("%d x [",(ulong)(uint)local_60->first);
          iVar7._M_current = iStack_70._M_current;
          if (local_78 != iStack_70._M_current) {
            bVar8 = true;
            ppVar15 = local_78;
            do {
              if (!bVar8) {
                printf(", ");
              }
              uVar9 = (ulong)(ppVar15->first + 1);
              if (ppVar15->second == -1) {
                printf("i=%d",uVar9);
              }
              else {
                printf("i=%d opt=%d",uVar9,(ulong)(ppVar15->second + 1));
              }
              ppVar15 = ppVar15 + 1;
              bVar8 = false;
            } while (ppVar15 != iVar7._M_current);
          }
          puts("]");
          if (local_78 != (pair<int,_int> *)0x0) {
            operator_delete(local_78);
          }
          ppVar10 = local_60 + 1;
        } while (ppVar10 != local_48);
      }
      lVar14 = local_50 + 1;
      uVar9 = (ulong)(local_58->inst).nbtypes;
    } while (lVar14 < (long)uVar9);
  }
  pAVar11 = local_58;
  if ((char)local_38 != '\0') {
    Instance::print(&local_58->inst);
  }
  if ((char)local_34 != '\0') {
    printf("PYSOL=(%d,[",(ulong)(uint)pAVar11->objvalue);
    if (0 < (pAVar11->inst).nbtypes) {
      lVar14 = 0;
      do {
        putchar(0x5b);
        pvVar2 = (pAVar11->sols).
                 super__Vector_base<std::vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>,_std::allocator<std::vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        ppVar10 = pvVar2[lVar14].
                  super__Vector_base<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_48 = *(pointer *)
                    ((long)&pvVar2[lVar14].
                            super__Vector_base<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data + 8);
        local_50 = lVar14;
        if (ppVar10 != local_48) {
          do {
            local_78 = (pair<int,_int> *)0x0;
            iStack_70._M_current = (pair<int,_int> *)0x0;
            local_68 = (pair<int,_int> *)0x0;
            ppVar12 = (ppVar10->second).
                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            ppVar3 = *(pointer *)
                      ((long)&(ppVar10->second).
                              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                              ._M_impl + 8);
            local_60 = ppVar10;
            if (ppVar12 != ppVar3) {
              do {
                if (0 < ppVar12->second) {
                  pIVar6 = (local_58->inst).items.super__Vector_base<Item,_std::allocator<Item>_>.
                           _M_impl.super__Vector_impl_data._M_start + ppVar12->first;
                  pVar5.first = pIVar6->type;
                  pVar5.second = pIVar6->opt;
                  iVar13 = 0;
                  do {
                    local_40 = pVar5;
                    if (iStack_70._M_current == local_68) {
                      std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
                      _M_realloc_insert<std::pair<int,int>>
                                ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
                                 &local_78,iStack_70,&local_40);
                    }
                    else {
                      *iStack_70._M_current = pVar5;
                      iStack_70._M_current = iStack_70._M_current + 1;
                    }
                    iVar13 = iVar13 + 1;
                  } while (iVar13 < ppVar12->second);
                }
                iVar7._M_current = iStack_70._M_current;
                ppVar15 = local_78;
                ppVar12 = ppVar12 + 1;
              } while (ppVar12 != ppVar3);
              if (local_78 != iStack_70._M_current) {
                uVar9 = (long)iStack_70._M_current - (long)local_78 >> 3;
                lVar14 = 0x3f;
                if (uVar9 != 0) {
                  for (; uVar9 >> lVar14 == 0; lVar14 = lVar14 + -1) {
                  }
                }
                std::
                __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                          (local_78,iStack_70._M_current,((uint)lVar14 ^ 0x3f) * 2 ^ 0x7e);
                std::
                __final_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__ops::_Iter_less_iter>
                          (ppVar15,iVar7._M_current);
              }
            }
            printf("(%d,[",(ulong)(uint)local_60->first);
            iVar7._M_current = iStack_70._M_current;
            for (ppVar15 = local_78; ppVar15 != iVar7._M_current; ppVar15 = ppVar15 + 1) {
              if (ppVar15->second == -1) {
                printf("(%d, 0),",(ulong)(uint)ppVar15->first);
              }
              else {
                printf("(%d, %d),",(ulong)(uint)ppVar15->first);
              }
            }
            printf("]),");
            if (local_78 != (pair<int,_int> *)0x0) {
              operator_delete(local_78);
            }
            ppVar10 = local_60 + 1;
          } while (ppVar10 != local_48);
        }
        printf("],");
        lVar14 = local_50 + 1;
        pAVar11 = local_58;
      } while (lVar14 < (local_58->inst).nbtypes);
    }
    puts("])");
  }
  return;
}

Assistant:

void ArcflowSol::print_solution(bool print_inst = true, bool pyout = false) {
	printf("Objective: %d\n", objvalue);
	printf("Solution:\n");
	for (int t = 0; t < inst.nbtypes; t++) {
		if (inst.nbtypes > 1) {
			printf("Bins of type %d: %d\n", t + 1, nbins[t]);
		}
		std::vector<pattern_pair> &sol = sols[t];
		for (const pattern_pair &pat : sol) {
			std::vector<int_pair> tmp;
			for (const int_pair &itpair : pat.second) {
				int t = inst.items[itpair.first].type;
				int opt = inst.items[itpair.first].opt;
				for (int i = 0; i < itpair.second; i++) {
					tmp.push_back(MP(t, opt));
				}
			}
			sort(all(tmp));
			printf("%d x [", pat.first);
			bool first = true;
			for (const int_pair &p : tmp) {
				if (first) {
					first = false;
				} else {
					printf(", ");
				}
				if (p.second == -1) {
					printf("i=%d", p.first + 1);
				} else {
					printf("i=%d opt=%d", p.first + 1, p.second + 1);
				}
			}
			printf("]\n");
		}
	}

	if (print_inst) {
		inst.print();
	}

	if (pyout) {
		printf("PYSOL=(%d,[", objvalue);
		for (int t = 0; t < inst.nbtypes; t++) {
			printf("[");
			std::vector<pattern_pair> &sol = sols[t];
			for (const pattern_pair &pat : sol) {
				std::vector<int_pair> tmp;
				for (const int_pair &itpair : pat.second) {
					int t = inst.items[itpair.first].type;
					int opt = inst.items[itpair.first].opt;
					for (int i = 0; i < itpair.second; i++) {
						tmp.push_back(MP(t, opt));
					}
				}
				sort(all(tmp));

				printf("(%d,[", pat.first);
				for (const int_pair &p : tmp) {
					if (p.second == -1) {
						printf("(%d, 0),", p.first);
					} else {
						printf("(%d, %d),", p.first, p.second);
					}
				}
				printf("]),");
			}
			printf("],");
		}
		printf("])\n");
	}
}